

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::StoreMatches(cmMakefile *this,RegularExpression *re)

{
  size_t sVar1;
  int iVar2;
  string *name;
  long lVar3;
  string_view value;
  string_view value_00;
  char nMatches [2];
  string local_50;
  
  name = matchVariables_abi_cxx11_;
  iVar2 = 0;
  for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_50,&re->regmatch,(int)lVar3);
    if (local_50._M_string_length != 0) {
      value._M_str._1_1_ = local_50._M_dataplus._M_p._1_1_;
      value._M_str._0_1_ = local_50._M_dataplus._M_p._0_1_;
      value._M_str._2_6_ = local_50._M_dataplus._M_p._2_6_;
      value._M_len = local_50._M_string_length;
      AddDefinition(this,name,value);
      cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
      iVar2 = (int)lVar3 + 0x30;
    }
    std::__cxx11::string::~string((string *)&local_50);
    name = name + 1;
  }
  local_50._M_dataplus._M_p._0_1_ = (undefined1)iVar2;
  local_50._M_dataplus._M_p._1_1_ = 0;
  sVar1 = strlen((char *)&local_50);
  value_00._M_str = (char *)&local_50;
  value_00._M_len = sVar1;
  AddDefinition(this,&nMatchesVariable_abi_cxx11_,value_00);
  cmStateSnapshot::GetDefinition(&this->StateSnapshot,&nMatchesVariable_abi_cxx11_);
  return;
}

Assistant:

void cmMakefile::StoreMatches(cmsys::RegularExpression& re)
{
  char highest = 0;
  for (int i = 0; i < 10; i++) {
    std::string const& m = re.match(i);
    if (!m.empty()) {
      std::string const& var = matchVariables[i];
      this->AddDefinition(var, m);
      this->MarkVariableAsUsed(var);
      highest = static_cast<char>('0' + i);
    }
  }
  char nMatches[] = { highest, '\0' };
  this->AddDefinition(nMatchesVariable, nMatches);
  this->MarkVariableAsUsed(nMatchesVariable);
}